

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O0

void binary_transform_reduce_sum<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  double dVar2;
  byte extraout_AL;
  anon_class_64_8_98fd1da9 *paVar3;
  undefined1 *__stat_loc;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Expression_lhs<const_int_&> EVar4;
  ResultBuilder DOCTEST_RB;
  Task ptask;
  Task stask;
  iterator end2;
  iterator beg2;
  iterator end1;
  iterator beg1;
  int sol;
  int sum;
  size_t c;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  size_t n;
  vector<Data,_std::allocator<Data>_> vec2;
  vector<Data,_std::allocator<Data>_> vec1;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffffb48;
  Task *tasks;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  Enum in_stack_fffffffffffffb64;
  int *in_stack_fffffffffffffb68;
  Enum at;
  Taskflow *in_stack_fffffffffffffb70;
  ResultBuilder *this;
  Executor *in_stack_fffffffffffffb80;
  anon_class_64_8_98fd1da9 *c_00;
  FlowBuilder *this_00;
  ExpressionDecomposer local_434;
  undefined4 in_stack_fffffffffffffbdc;
  undefined8 in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  __basic_future<void> local_388 [2];
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_350;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_348;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_340;
  FlowBuilder local_338;
  undefined1 local_330 [16];
  vector<Data,_std::allocator<Data>_> *local_320;
  Data **local_318;
  anon_class_64_8_98fd1da9 **local_310;
  undefined8 *local_308;
  anon_union_24_2_13149d16_for_String_2 local_300;
  undefined8 local_2e0;
  undefined8 local_2d8;
  Data *local_2d0;
  Data *local_2c8;
  undefined4 local_2c0;
  undefined4 local_2bc;
  long local_2b8;
  int *local_2b0;
  int *local_2a8;
  int local_29c [5];
  initializer_list<int> local_288;
  initializer_list<int> *local_278;
  anon_class_64_8_98fd1da9 *local_270;
  undefined1 local_261 [33];
  vector<Data,_std::allocator<Data>_> local_240;
  undefined1 local_228 [232];
  undefined1 local_140 [320];
  
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),in_stack_fffffffffffffb48
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffc38);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1d8c56);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffb70);
  std::allocator<Data>::allocator((allocator<Data> *)0x1d8c77);
  std::vector<Data,_std::allocator<Data>_>::vector
            ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffb70,
             (size_type)in_stack_fffffffffffffb68,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  std::allocator<Data>::~allocator((allocator<Data> *)0x1d8c9d);
  this_00 = (FlowBuilder *)local_261;
  std::allocator<Data>::allocator((allocator<Data> *)0x1d8caf);
  std::vector<Data,_std::allocator<Data>_>::vector
            ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffb70,
             (size_type)in_stack_fffffffffffffb68,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  std::allocator<Data>::~allocator((allocator<Data> *)0x1d8cd5);
  local_270 = (anon_class_64_8_98fd1da9 *)0x1;
  do {
    c_00 = local_270;
    paVar3 = (anon_class_64_8_98fd1da9 *)std::vector<Data,_std::allocator<Data>_>::size(&local_240);
    if (paVar3 <= c_00) {
      std::vector<Data,_std::allocator<Data>_>::~vector
                ((vector<Data,_std::allocator<Data>_> *)
                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
      std::vector<Data,_std::allocator<Data>_>::~vector
                ((vector<Data,_std::allocator<Data>_> *)
                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
      tf::Executor::~Executor(in_stack_fffffffffffffb80);
      return;
    }
    local_29c[0] = 0;
    local_29c[1] = 1;
    local_29c[2] = 3;
    local_29c[3] = 7;
    local_29c[4] = 99;
    local_288._M_array = local_29c;
    local_288._M_len = 5;
    local_278 = &local_288;
    local_2a8 = std::initializer_list<int>::begin(local_278);
    local_2b0 = std::initializer_list<int>::end
                          ((initializer_list<int> *)
                           CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    for (; at = (Enum)((ulong)in_stack_fffffffffffffb68 >> 0x20), local_2a8 != local_2b0;
        local_2a8 = local_2a8 + 1) {
      local_2b8 = (long)*local_2a8;
      local_2bc = 100;
      local_2c0 = 100;
      local_2c8 = (Data *)std::vector<Data,_std::allocator<Data>_>::end
                                    ((vector<Data,_std::allocator<Data>_> *)
                                     in_stack_fffffffffffffb48);
      local_2d0 = (Data *)std::vector<Data,_std::allocator<Data>_>::end
                                    ((vector<Data,_std::allocator<Data>_> *)
                                     in_stack_fffffffffffffb48);
      in_stack_fffffffffffffb80 = (Executor *)(local_261 + 1);
      local_2d8 = std::vector<Data,_std::allocator<Data>_>::end
                            ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffb48);
      local_2e0 = std::vector<Data,_std::allocator<Data>_>::end
                            ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffb48);
      tf::Taskflow::clear((Taskflow *)0x1d8e36);
      local_330._8_8_ = &local_2c8;
      local_318 = &local_2d0;
      local_310 = &local_270;
      local_308 = &local_2d8;
      local_300._8_8_ = &local_2e0;
      local_300._16_8_ = &local_2bc;
      local_320 = &local_240;
      local_300.data.ptr = (char *)in_stack_fffffffffffffb80;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:1339:37),_nullptr>
                (this_00,c_00);
      tf::Task::Task((Task *)local_330);
      local_340 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffffb48);
      local_348 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffffb48);
      local_350 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffffb48);
      tf::GuidedPartitioner<tf::DefaultClosureWrapper>::GuidedPartitioner
                ((GuidedPartitioner<tf::DefaultClosureWrapper> *)
                 CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 (size_t)in_stack_fffffffffffffb48);
      tasks = (Task *)CONCAT44(uStack_364,local_368);
      in_stack_fffffffffffffb50 = uStack_360;
      in_stack_fffffffffffffb54 = uStack_35c;
      tf::FlowBuilder::
      transform_reduce<std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:1353:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:1354:9),_tf::GuidedPartitioner<tf::DefaultClosureWrapper>,_nullptr>
                (&local_338,local_228,local_340,local_348,local_350,&local_2c0);
      this = (ResultBuilder *)local_330;
      tf::Task::operator=((Task *)this,(Task *)&local_338);
      tf::Task::precede<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),tasks);
      __stat_loc = local_140;
      tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                        (Taskflow *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
      std::__basic_future<void>::wait(local_388,__stat_loc);
      tf::Future<void>::~Future
                ((Future<void> *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
      in_stack_fffffffffffffb48 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                (this,at,(char *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                 in_stack_fffffffffffffb5c,
                 (char *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),"",
                 (char *)in_stack_fffffffffffffb80);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_434,DT_REQUIRE);
      EVar4 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                         (int *)in_stack_fffffffffffffb48);
      in_stack_fffffffffffffb68 = EVar4.lhs;
      in_stack_fffffffffffffb64 = EVar4.m_at;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                ((Expression_lhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffb64),
                 in_stack_fffffffffffffb68);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 in_stack_fffffffffffffb48);
      doctest::detail::Result::~Result((Result *)0x1d90b2);
      dVar2 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&stack0xfffffffffffffc00,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      in_stack_fffffffffffffb60 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffb60);
      if ((extraout_AL & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1d924c);
    }
    local_270 = (anon_class_64_8_98fd1da9 *)((long)&local_270->beg1 + 1);
  } while( true );
}

Assistant:

void binary_transform_reduce_sum(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<Data> vec1(1000);
  std::vector<Data> vec2(1000);

  for(size_t n=1; n<vec1.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      auto sum = 100;
      auto sol = 100;
      auto beg1 = vec1.end();
      auto end1 = vec1.end();
      auto beg2 = vec2.end();
      auto end2 = vec2.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg1 = vec1.begin();
        end1 = vec1.begin() + n;
        beg2 = vec2.begin();
        end2 = vec2.begin() + n;
        for(auto itr1 = beg1, itr2 = beg2; itr1 != end1 && itr2 != end2; itr1++, itr2++) {
          sum += (itr1->get() + itr2->get());
        }
      });

      tf::Task ptask;

      ptask = taskflow.transform_reduce(
        std::ref(beg1), std::ref(end1), std::ref(beg2), sol,
        [] (int l, int r)   { return  l + r; },
        [] (const Data& data1, const Data& data2) { return data1.get() + data2.get(); },
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(sol == sum);
      
    }
  }
}